

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O0

char * FormatName(ALenum format)

{
  ALenum format_local;
  char *local_8;
  
  if (format == 0x1100) {
    local_8 = "Mono, U8";
  }
  else if (format == 0x1101) {
    local_8 = "Mono, S16";
  }
  else if (format == 0x1102) {
    local_8 = "Stereo, U8";
  }
  else if (format == 0x1103) {
    local_8 = "Stereo, S16";
  }
  else if (format == 0x10010) {
    local_8 = "Mono, Float32";
  }
  else if (format == 0x10011) {
    local_8 = "Stereo, Float32";
  }
  else if (format == 0x20021) {
    local_8 = "B-Format 2D, U8";
  }
  else if (format == 0x20022) {
    local_8 = "B-Format 2D, S16";
  }
  else if (format == 0x20023) {
    local_8 = "B-Format 2D, Float32";
  }
  else if (format == 0x20031) {
    local_8 = "B-Format 3D, U8";
  }
  else if (format == 0x20032) {
    local_8 = "B-Format 3D, S16";
  }
  else if (format == 0x20033) {
    local_8 = "B-Format 3D, Float32";
  }
  else {
    local_8 = "Unknown Format";
  }
  return local_8;
}

Assistant:

const char *FormatName(ALenum format)
{
    switch(format)
    {
    case AL_FORMAT_MONO8: return "Mono, U8";
    case AL_FORMAT_MONO16: return "Mono, S16";
    case AL_FORMAT_MONO_FLOAT32: return "Mono, Float32";
    case AL_FORMAT_STEREO8: return "Stereo, U8";
    case AL_FORMAT_STEREO16: return "Stereo, S16";
    case AL_FORMAT_STEREO_FLOAT32: return "Stereo, Float32";
    case AL_FORMAT_BFORMAT2D_8: return "B-Format 2D, U8";
    case AL_FORMAT_BFORMAT2D_16: return "B-Format 2D, S16";
    case AL_FORMAT_BFORMAT2D_FLOAT32: return "B-Format 2D, Float32";
    case AL_FORMAT_BFORMAT3D_8: return "B-Format 3D, U8";
    case AL_FORMAT_BFORMAT3D_16: return "B-Format 3D, S16";
    case AL_FORMAT_BFORMAT3D_FLOAT32: return "B-Format 3D, Float32";
    }
    return "Unknown Format";
}